

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool __thiscall QDir::cd(QDir *this,QString *dirName)

{
  char16_t cVar1;
  long lVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  QDirPrivate *pQVar6;
  qsizetype qVar7;
  pointer __p;
  QFileSystemEntry *this_00;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (dirName->d).size;
  bVar5 = true;
  if ((lVar2 == 0) || ((pQVar6 = (this->d_ptr).d.ptr, lVar2 == 1 && (*(dirName->d).ptr == L'.'))))
  goto LAB_001285bf;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  bVar5 = isAbsolutePath(dirName);
  if (bVar5) {
    QString::operator=((QString *)&local_58,dirName);
    qt_cleanPath((QString *)&local_58);
    goto LAB_00128425;
  }
  this_00 = &pQVar6->dirEntry;
  QFileSystemEntry::filePath((QString *)&local_78,this_00);
  qVar7 = local_58.size;
  pcVar4 = local_58.ptr;
  pDVar3 = local_58.d;
  local_58.d = local_78.d;
  local_58.ptr = local_78.ptr;
  local_78.d = pDVar3;
  local_78.ptr = pcVar4;
  local_58.size = local_78.size;
  local_78.size = qVar7;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  bVar5 = QString::endsWith((QString *)&local_58,(QChar)0x2f,CaseSensitive);
  if (!bVar5) {
    QString::append((QString *)&local_58,(QChar)0x2f);
  }
  QString::append((QString *)&local_58,dirName);
  qVar7 = QString::indexOf(dirName,(QChar)0x2f,0,CaseSensitive);
  if (qVar7 < 0) {
    local_88.m_data = "..";
    local_88.m_size = 2;
    bVar5 = operator==(dirName,&local_88);
    if (bVar5) goto LAB_0012852a;
    QFileSystemEntry::filePath((QString *)&local_78,this_00);
    if (local_78.size == 1) {
      cVar1 = *local_78.ptr;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      if (cVar1 == L'.') goto LAB_0012852a;
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
LAB_00128425:
    pQVar6 = (QDirPrivate *)operator_new(0x118);
    QDirPrivate::QDirPrivate(pQVar6,(this->d_ptr).d.ptr);
    local_78.d = (Data *)pQVar6;
    QDirPrivate::setPath(pQVar6,(QString *)&local_58);
    bVar5 = QDirPrivate::exists(pQVar6);
    if (bVar5) {
      local_78.d = (Data *)0x0;
      QSharedDataPointer<QDirPrivate>::reset(&this->d_ptr,pQVar6);
    }
    std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::~unique_ptr
              ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)&local_78);
  }
  else {
LAB_0012852a:
    bVar5 = qt_cleanPath((QString *)&local_58);
    if (bVar5) {
      s.m_size = 2;
      s.m_data = "..";
      bVar5 = QString::startsWith((QString *)&local_58,s,CaseSensitive);
      if (bVar5) {
        QFileInfo::QFileInfo((QFileInfo *)&local_88,(QString *)&local_58);
        QFileInfo::absoluteFilePath((QString *)&local_78,(QFileInfo *)&local_88);
        qVar7 = local_58.size;
        pcVar4 = local_58.ptr;
        pDVar3 = local_58.d;
        local_58.d = local_78.d;
        local_58.ptr = local_78.ptr;
        local_78.d = pDVar3;
        local_78.ptr = pcVar4;
        local_58.size = local_78.size;
        local_78.size = qVar7;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QFileInfo::~QFileInfo((QFileInfo *)&local_88);
      }
      goto LAB_00128425;
    }
    bVar5 = false;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_001285bf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QDir::cd(const QString &dirName)
{
    // Don't detach just yet.
    const QDirPrivate * const d = d_ptr.constData();

    if (dirName.isEmpty() || dirName == u'.')
        return true;
    QString newPath;
    if (isAbsolutePath(dirName)) {
        newPath = dirName;
        qt_cleanPath(&newPath);
    } else {
        newPath = d->dirEntry.filePath();
        if (!newPath.endsWith(u'/'))
            newPath += u'/';
        newPath += dirName;
        if (dirName.indexOf(u'/') >= 0
            || dirName == ".."_L1
            || d->dirEntry.filePath() == u'.') {
            if (!qt_cleanPath(&newPath))
                return false;
            /*
              If newPath starts with .., we convert it to absolute to
              avoid infinite looping on

                  QDir dir(".");
                  while (dir.cdUp())
                      ;
            */
            if (newPath.startsWith(".."_L1)) {
                newPath = QFileInfo(newPath).absoluteFilePath();
            }
        }
    }

    std::unique_ptr<QDirPrivate> dir(new QDirPrivate(*d_ptr.constData()));
    dir->setPath(newPath);
    if (!dir->exists())
        return false;

    d_ptr = dir.release();
    return true;
}